

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float64 float64_log2_s390x(float64 a,float_status *status)

{
  bool bVar1;
  long lVar2;
  float64 fVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if ((status->flush_inputs_to_zero != '\0') &&
     ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0)) {
    a = a & 0x8000000000000000;
    status->float_exception_flags = status->float_exception_flags | 0x40;
  }
  uVar6 = a & 0xfffffffffffff;
  uVar7 = (uint)(a >> 0x34) & 0x7ff;
  if (uVar7 == 0) {
    if (uVar6 == 0) {
      return 0xfff0000000000000;
    }
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar7 = ((uint)lVar2 ^ 0x3f) + 0xf5;
    uVar6 = uVar6 << ((byte)uVar7 & 0x3f);
    uVar7 = 1 - (uVar7 & 0xff);
  }
  if ((long)a < 0) {
    status->float_exception_flags = status->float_exception_flags | 1;
    a = 0x7ff8000000000000;
  }
  else {
    if (uVar7 != 0x7ff) {
      uVar6 = uVar6 | 0x10000000000000;
      uVar8 = (ulong)(uVar7 + 0xc01) << 0x34;
      uVar9 = 0x8000000000000;
      do {
        uVar5 = uVar6 >> 0x20;
        uVar10 = (uVar6 & 0xffffffff) * uVar5;
        uVar11 = uVar10 >> 0x1f;
        uVar5 = ((uVar11 & 0xffffffff) + uVar5 * uVar5 + (uVar11 & 0x100000000) +
                (ulong)(uVar6 * uVar6 < uVar10 << 0x21)) * 0x1000;
        uVar10 = uVar5 | uVar6 * uVar6 >> 0x34;
        uVar6 = uVar10 >> ((byte)(uVar5 >> 0x35) & 1);
        uVar8 = uVar8 | (long)(uVar10 << 10) >> 0x3f & uVar9;
        bVar1 = 1 < uVar9;
        uVar9 = uVar9 >> 1;
      } while (bVar1);
      uVar6 = -uVar8;
      if (0x3fe < (int)uVar7) {
        uVar6 = uVar8;
      }
      if (uVar6 == 0) {
        uVar4 = 0x40;
      }
      else {
        lVar2 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar4 = (uint)lVar2 ^ 0x3f;
      }
      fVar3 = roundAndPackFloat64((int)uVar7 < 0x3ff,0x409 - uVar4,
                                  uVar6 << ((char)uVar4 - 1U & 0x3f),status);
      return fVar3;
    }
    if (uVar6 != 0) {
      fVar3 = propagateFloat64NaN(a,0,status);
      return fVar3;
    }
  }
  return a;
}

Assistant:

float64 float64_log2(float64 a, float_status *status)
{
    flag aSign, zSign;
    int aExp;
    uint64_t aSig, aSig0, aSig1, zSig, i;
    a = float64_squash_input_denormal(a, status);

    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );

    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat64( 1, 0x7FF, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    if ( aSign ) {
        float_raise(float_flag_invalid, status);
        return float64_default_nan(status);
    }
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return propagateFloat64NaN(a, float64_zero, status);
        }
        return a;
    }

    aExp -= 0x3FF;
    aSig |= UINT64_C(0x0010000000000000);
    zSign = aExp < 0;
    zSig = (uint64_t)aExp << 52;
    for (i = 1LL << 51; i > 0; i >>= 1) {
        mul64To128( aSig, aSig, &aSig0, &aSig1 );
        aSig = ( aSig0 << 12 ) | ( aSig1 >> 52 );
        if ( aSig & UINT64_C(0x0020000000000000) ) {
            aSig >>= 1;
            zSig |= i;
        }
    }

    if ( zSign )
#ifdef _MSC_VER
        zSig = 0 - zSig;
#else
        zSig = -zSig;
#endif
    return normalizeRoundAndPackFloat64(zSign, 0x408, zSig, status);
}